

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * qUncompress(uchar *data,qsizetype nbytes)

{
  QByteArrayView input;
  uint uVar1;
  long in_RDX;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  storage_type *unaff_retaddr;
  undefined1 in_stack_00000030 [16];
  undefined1 in_stack_00000040 [16];
  function_ref_base<false,_const_void,_void,_z_stream_s_*> in_stack_00000050;
  qsizetype capacity;
  size_t MaxDecompressedSize;
  uint expectedSize;
  qsizetype HeaderSize;
  QArrayDataPointer<char> d;
  anon_class_1_0_00000001 *in_stack_fffffffffffffec8;
  ZLibOp op;
  function_ref<int_(z_stream_s_*,_unsigned_long)_const> *in_stack_fffffffffffffed0;
  uchar *in_stack_fffffffffffffed8;
  QByteArrayView *in_stack_fffffffffffffee0;
  qsizetype in_stack_fffffffffffffee8;
  QArrayDataPointer<char> *in_stack_fffffffffffffef0;
  QArrayDataPointer<char> *in_stack_fffffffffffffef8;
  QArrayDataPointer<char> *this;
  QArrayDataPointer<char> *in_stack_ffffffffffffff60;
  ZLibOp in_stack_ffffffffffffff6f;
  QArrayDataPointer<char> *pQStack_68;
  QArrayDataPointer<char> local_38;
  ulong local_18;
  long local_10;
  qsizetype qVar2;
  
  qVar2 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  op = (ZLibOp)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  if (in_RSI == 0) {
    dataIsNull(op);
  }
  else if (in_RDX < 0) {
    lengthIsNegative(op);
  }
  else if (in_RDX < 4) {
    invalidCompressedData();
  }
  else {
    local_10 = in_RDX;
    uVar1 = qFromBigEndian<unsigned_int>(in_stack_fffffffffffffed0);
    if (local_10 == 4) {
      if (uVar1 == 0) {
        QByteArray::QByteArray((QByteArray *)0x4b305e);
      }
      else {
        invalidCompressedData();
      }
    }
    else {
      local_18 = (ulong)uVar1;
      std::max<long_long>((longlong *)&local_18,&local_10);
      local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
      this = &local_38;
      QArrayDataPointer<char>::QArrayDataPointer
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (qsizetype)in_stack_fffffffffffffee0,
                 (AllocationOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      QArrayDataPointer<char>::QArrayDataPointer(this,in_stack_fffffffffffffef8);
      QByteArrayView::QByteArrayView<unsigned_char,_true>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (qsizetype)in_stack_fffffffffffffed0);
      qxp::function_ref<int_(z_stream_s_*)_const>::function_ref_base
                ((function_ref<int_(z_stream_s_*)_const> *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8);
      qxp::function_ref<int_(z_stream_s_*,_unsigned_long)_const>::function_ref_base
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      qxp::function_ref<void_(z_stream_s_*)_const>::function_ref_base
                ((function_ref<void_(z_stream_s_*)_const> *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8);
      input.m_data = unaff_retaddr;
      input.m_size = qVar2;
      xxflate(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60,input,
              (function_ref<int_(z_stream_s_*)_const>)in_stack_00000030,
              (function_ref<int_(z_stream_s_*,_unsigned_long)_const>)in_stack_00000040,
              (function_ref<void_(z_stream_s_*)_const>)in_stack_00000050);
      QArrayDataPointer<char>::~QArrayDataPointer(pQStack_68);
      QArrayDataPointer<char>::~QArrayDataPointer(pQStack_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar2) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray qUncompress(const uchar* data, qsizetype nbytes)
{
    if (!data)
        return dataIsNull(ZLibOp::Decompression);

    if (nbytes < 0)
        return lengthIsNegative(ZLibOp::Decompression);

    constexpr qsizetype HeaderSize = sizeof(CompressSizeHint_t);
    if (nbytes < HeaderSize)
        return invalidCompressedData();

    const auto expectedSize = qFromBigEndian<CompressSizeHint_t>(data);
    if (nbytes == HeaderSize) {
        if (expectedSize != 0)
            return invalidCompressedData();
        return QByteArray();
    }

    constexpr auto MaxDecompressedSize = size_t(QByteArray::maxSize());
    if constexpr (MaxDecompressedSize < std::numeric_limits<CompressSizeHint_t>::max()) {
        if (expectedSize > MaxDecompressedSize)
            return tooMuchData(ZLibOp::Decompression);
    }

    // expectedSize may be truncated, so always use at least nbytes
    // (larger by at most 1%, according to zlib docs)
    qsizetype capacity = std::max(qsizetype(expectedSize), // cannot overflow!
                                  nbytes);

    QArrayDataPointer<char> d(capacity);
    return xxflate(ZLibOp::Decompression, std::move(d), {data + HeaderSize, nbytes - HeaderSize},
                   [] (z_stream *zs) { return inflateInit(zs); },
                   [] (z_stream *zs, size_t) { return inflate(zs, Z_NO_FLUSH); },
                   [] (z_stream *zs) { inflateEnd(zs); });
}